

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLSafe.cxx
# Opt level: O3

ostream * operator<<(ostream *os,cmXMLSafe *self)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  byte *first;
  byte *last;
  uint ch;
  char buf [16];
  uint local_54;
  cmXMLSafe *local_50;
  char local_48 [24];
  
  if (self->Size != 0) {
    first = (byte *)self->Data;
    last = first + self->Size;
    local_50 = self;
    do {
      pbVar2 = (byte *)cm_utf8_decode_character((char *)first,(char *)last,&local_54);
      if (pbVar2 == (byte *)0x0) {
        bVar1 = *first;
        first = first + 1;
        local_54 = (uint)bVar1;
        sprintf(local_48,"%X");
        std::__ostream_insert<char,std::char_traits<char>>(os,"[NON-UTF-8-BYTE-0x",0x12);
        sVar3 = strlen(local_48);
        std::__ostream_insert<char,std::char_traits<char>>(os,local_48,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
      }
      else if (((local_54 - 0x10000 < 0x100000) || (local_54 - 0x20 < 0xd7e0)) ||
              (local_54 - 0xe000 < 0x1ffe)) {
        if ((int)local_54 < 0x27) {
          if (local_54 == 0x22) {
            bVar1 = local_50->DoQuotes;
            pcVar6 = "\"";
            pcVar4 = "&quot;";
            goto LAB_00138f98;
          }
          if (local_54 != 0x26) goto LAB_00138e2c;
          lVar5 = 5;
          pcVar6 = "&amp;";
        }
        else if (local_54 == 0x27) {
          bVar1 = local_50->DoQuotes;
          pcVar6 = "\'";
          pcVar4 = "&apos;";
LAB_00138f98:
          if ((ulong)bVar1 != 0) {
            pcVar6 = pcVar4;
          }
          lVar5 = (ulong)bVar1 * 5 + 1;
        }
        else if (local_54 == 0x3c) {
          lVar5 = 4;
          pcVar6 = "&lt;";
        }
        else {
          if (local_54 != 0x3e) goto LAB_00138e2c;
          lVar5 = 4;
          pcVar6 = "&gt;";
        }
LAB_00138fa6:
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar5);
        first = pbVar2;
      }
      else if (local_54 - 9 < 2) {
LAB_00138e2c:
        std::ostream::write((char *)os,(long)first);
        first = pbVar2;
      }
      else {
        first = pbVar2;
        if (local_54 != 0xd) {
          sprintf(local_48,"%X");
          std::__ostream_insert<char,std::char_traits<char>>(os,"[NON-XML-CHAR-0x",0x10);
          sVar3 = strlen(local_48);
          std::__ostream_insert<char,std::char_traits<char>>(os,local_48,sVar3);
          lVar5 = 1;
          pcVar6 = "]";
          goto LAB_00138fa6;
        }
      }
    } while (first != last);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, cmXMLSafe const& self)
{
  char const* first = self.Data;
  char const* last = self.Data + self.Size;
  while(first != last)
    {
    unsigned int ch;
    if(const char* next = cm_utf8_decode_character(first, last, &ch))
      {
      // http://www.w3.org/TR/REC-xml/#NT-Char
      if((ch >= 0x20 && ch <= 0xD7FF) ||
         (ch >= 0xE000 && ch <= 0xFFFD) ||
         (ch >= 0x10000 && ch <= 0x10FFFF) ||
          ch == 0x9 || ch == 0xA || ch == 0xD)
        {
        switch(ch)
          {
          // Escape XML control characters.
          case '&': os << "&amp;"; break;
          case '<': os << "&lt;"; break;
          case '>': os << "&gt;"; break;
          case '"': os << (self.DoQuotes? "&quot;" : "\""); break;
          case '\'': os << (self.DoQuotes? "&apos;" : "'"); break;
          case '\r': break; // Ignore CR
          // Print the UTF-8 character.
          default: os.write(first, next-first); break;
          }
        }
      else
        {
        // Use a human-readable hex value for this invalid character.
        char buf[16];
        sprintf(buf, "%X", ch);
        os << "[NON-XML-CHAR-0x" << buf << "]";
        }

      first = next;
      }
    else
      {
      ch = static_cast<unsigned char>(*first++);
      // Use a human-readable hex value for this invalid byte.
      char buf[16];
      sprintf(buf, "%X", ch);
      os << "[NON-UTF-8-BYTE-0x" << buf << "]";
      }
    }
  return os;
}